

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.c
# Opt level: O1

int TestSuite_Run(TestSuite *suite)

{
  Test **ppTVar1;
  pthread_mutex_t *__s;
  FILE *pFVar2;
  int iVar3;
  size_t sVar4;
  Test *pTVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  pthread_mutex_t *__s_00;
  pthread_mutex_t *ppVar11;
  int iVar12;
  bool bVar13;
  pthread_mutex_t mutex;
  char name [128];
  utsname uStack_286;
  TestSuite *pTStack_100;
  undefined *puStack_f8;
  pthread_mutex_t *ppStack_f0;
  int local_e4;
  pthread_mutex_t local_e0;
  pthread_mutex_t local_b8 [3];
  
  if ((suite->flags & 4) == 0) {
    ppStack_f0 = (pthread_mutex_t *)0x120096;
    ppVar11 = (pthread_mutex_t *)suite;
    TestSuite_PrintJsonHeader(suite,(FILE *)_stdout);
    __s_00 = (pthread_mutex_t *)suite->outfile;
    if (__s_00 != (pthread_mutex_t *)0x0) {
      ppStack_f0 = (pthread_mutex_t *)0x1200a7;
      ppVar11 = (pthread_mutex_t *)suite;
      TestSuite_PrintJsonHeader(suite,(FILE *)&__s_00->__data);
    }
    pFVar2 = _stdout;
    if (suite->tests == (Test *)0x0) {
      ppStack_f0 = (pthread_mutex_t *)0x120103;
      fwrite("  ]\n}\n",6,1,_stdout);
      ppStack_f0 = (pthread_mutex_t *)0x12010b;
      fflush(pFVar2);
      pFVar2 = (FILE *)suite->outfile;
      iVar12 = 0;
      if (pFVar2 != (FILE *)0x0) {
        ppStack_f0 = (pthread_mutex_t *)0x120134;
        fwrite("  ]\n}\n",6,1,pFVar2);
        ppStack_f0 = (pthread_mutex_t *)0x12013c;
        fflush(pFVar2);
        iVar12 = 0;
      }
    }
    else {
      ppTVar1 = &suite->tests;
      __s = (pthread_mutex_t *)suite->testname;
      if (__s == (pthread_mutex_t *)0x0) {
        if ((suite->flags & 8) != 0) goto LAB_0012032e;
        local_e0.__data.__lock = 0;
        ppStack_f0 = (pthread_mutex_t *)0x12015f;
        pthread_mutex_init((pthread_mutex_t *)local_b8,(pthread_mutexattr_t *)0x0);
        pTVar5 = (Test *)ppTVar1;
        iVar3 = -2;
        do {
          iVar12 = iVar3;
          pTVar5 = pTVar5->next;
          iVar3 = iVar12 + 1;
        } while (pTVar5 != (Test *)0x0);
        local_e0.__data.__lock = iVar12 + 2;
        pTVar5 = *ppTVar1;
        iVar12 = 0;
        if (pTVar5 != (Test *)0x0) {
          do {
            iVar10 = iVar3;
            ppStack_f0 = (pthread_mutex_t *)0x12019f;
            iVar3 = TestSuite_RunTest(suite,pTVar5,local_b8,(int *)local_e0.__size);
            iVar12 = iVar12 + iVar3;
            pTVar5 = pTVar5->next;
            iVar3 = iVar10 + -1;
            local_e0.__data.__lock = iVar10;
          } while (pTVar5 != (Test *)0x0);
        }
        pFVar2 = _stdout;
        ppStack_f0 = (pthread_mutex_t *)0x1201d3;
        fwrite("  ]\n}\n",6,1,_stdout);
        ppStack_f0 = (pthread_mutex_t *)0x1201db;
        fflush(pFVar2);
        pFVar2 = (FILE *)suite->outfile;
        if (pFVar2 != (FILE *)0x0) {
          ppStack_f0 = (pthread_mutex_t *)0x1201fd;
          fwrite("  ]\n}\n",6,1,pFVar2);
          ppStack_f0 = (pthread_mutex_t *)0x120205;
          fflush(pFVar2);
        }
        ppVar11 = local_b8;
      }
      else {
        local_e4 = 1;
        ppStack_f0 = (pthread_mutex_t *)0x1200cf;
        ppVar11 = __s;
        sVar4 = strlen(__s->__size);
        if (sVar4 == 0) {
          bVar13 = false;
        }
        else {
          bVar13 = __s->__size[sVar4 - 1] == '*';
        }
        if (suite == (TestSuite *)0x0) {
          ppStack_f0 = (pthread_mutex_t *)0x12032e;
          TestSuite_Run_cold_2();
LAB_0012032e:
          local_e0.__data.__lock = 0;
          if (suite != (TestSuite *)0x0) {
            ppVar11 = local_b8;
            __s_00 = &local_e0;
            ppStack_f0 = (pthread_mutex_t *)0x120350;
            TestSuite_Run_cold_3();
          }
          ppStack_f0 = (pthread_mutex_t *)TestSuite_PrintJsonHeader;
          TestSuite_Run_cold_4();
          puStack_f8 = &stdout;
          pTStack_100 = suite;
          ppStack_f0 = __s;
          if (ppVar11 != (pthread_mutex_t *)0x0) {
            fwrite("{\n",2,1,(FILE *)&__s_00->__data);
            iVar12 = uname(&uStack_286);
            if (iVar12 == -1) {
              perror("uname()");
            }
            else {
              lVar6 = sysconf(0x1e);
              lVar7 = sysconf(0x55);
              fprintf((FILE *)&__s_00->__data,
                      "  \"host\": {\n    \"sysname\": \"%s\",\n    \"release\": \"%s\",\n    \"machine\": \"%s\",\n    \"memory\": {\n      \"pagesize\": %lu,\n      \"npages\": %lu\n    }\n  },\n"
                      ,&uStack_286,uStack_286.release,uStack_286.machine,lVar6,lVar7);
            }
            pcVar8 = "false";
            pcVar9 = "true";
            if ((*(uint *)(ppVar11->__size + 0x28) & 8) == 0) {
              pcVar9 = "false";
            }
            if ((*(uint *)(ppVar11->__size + 0x28) & 2) == 0) {
              pcVar8 = "true";
            }
            fprintf((FILE *)&__s_00->__data,
                    "  \"options\": {\n    \"parallel\": %s,\n    \"fork\": %s\n  },\n  \"results\": [\n"
                    ,pcVar9,pcVar8);
            iVar12 = fflush((FILE *)&__s_00->__data);
            return iVar12;
          }
          TestSuite_PrintJsonHeader_cold_1();
          fwrite("  ]\n}\n",6,1,(FILE *)&ppVar11->__data);
          iVar12 = fflush((FILE *)&ppVar11->__data);
          return iVar12;
        }
        iVar12 = 0;
        ppStack_f0 = (pthread_mutex_t *)0x12022a;
        pthread_mutex_init((pthread_mutex_t *)&local_e0,(pthread_mutexattr_t *)0x0);
        pTVar5 = *ppTVar1;
        if (pTVar5 != (Test *)0x0) {
          iVar12 = 0;
          do {
            ppStack_f0 = (pthread_mutex_t *)0x12025a;
            snprintf(local_b8[0].__size,0x80,"%s%s",suite->name,pTVar5->name);
            if (bVar13) {
              ppStack_f0 = (pthread_mutex_t *)0x120267;
              sVar4 = strlen(__s->__size);
              ppStack_f0 = (pthread_mutex_t *)0x120276;
              iVar3 = strncmp(local_b8[0].__size,__s->__size,sVar4 - 1);
            }
            else {
              ppStack_f0 = (pthread_mutex_t *)0x120283;
              iVar3 = strcmp(local_b8[0].__size,__s->__size);
            }
            if (iVar3 == 0) {
              ppStack_f0 = (pthread_mutex_t *)0x12029c;
              iVar3 = TestSuite_RunTest(suite,pTVar5,&local_e0,&local_e4);
              iVar12 = iVar12 + iVar3;
            }
            pTVar5 = pTVar5->next;
          } while (pTVar5 != (Test *)0x0);
        }
        pFVar2 = _stdout;
        ppStack_f0 = (pthread_mutex_t *)0x1202cb;
        fwrite("  ]\n}\n",6,1,_stdout);
        ppStack_f0 = (pthread_mutex_t *)0x1202d3;
        fflush(pFVar2);
        pFVar2 = (FILE *)suite->outfile;
        if (pFVar2 != (FILE *)0x0) {
          ppStack_f0 = (pthread_mutex_t *)0x1202f5;
          fwrite("  ]\n}\n",6,1,pFVar2);
          ppStack_f0 = (pthread_mutex_t *)0x1202fd;
          fflush(pFVar2);
        }
        ppVar11 = &local_e0;
      }
      ppStack_f0 = (pthread_mutex_t *)0x120307;
      pthread_mutex_destroy((pthread_mutex_t *)ppVar11);
    }
  }
  else {
    ppStack_f0 = (pthread_mutex_t *)0x120324;
    TestSuite_Run_cold_1();
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

int
TestSuite_Run (TestSuite *suite) /* IN */
{
   int failures = 0;

   if ((suite->flags & TEST_HELPONLY)) {
      TestSuite_PrintHelp (suite, stderr);
      return 0;
   }

   TestSuite_PrintJsonHeader (suite, stdout);
   if (suite->outfile) {
      TestSuite_PrintJsonHeader (suite, suite->outfile);
   }

   if (suite->tests) {
      if (suite->testname) {
         failures += TestSuite_RunNamed (suite, suite->testname);
      } else if ((suite->flags & TEST_THREADS)) {
         TestSuite_RunParallel (suite);
      } else {
         failures += TestSuite_RunSerial (suite);
      }
   } else {
      TestSuite_PrintJsonFooter (stdout);
      if (suite->outfile) {
         TestSuite_PrintJsonFooter (suite->outfile);
      }
   }

   return failures;
}